

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall
Search::search::get_test_action_sequence
          (search *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  pointer puVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  puVar1 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  lVar3 = 0;
  for (uVar2 = 0;
      puVar1 = (this->priv->test_action_sequence).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->priv->test_action_sequence).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar2 = uVar2 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (V,(value_type_conflict2 *)((long)puVar1 + lVar3));
    lVar3 = lVar3 + 4;
  }
  return;
}

Assistant:

void search::get_test_action_sequence(vector<action>& V)
{
  V.clear();
  for (size_t i = 0; i < this->priv->test_action_sequence.size(); i++) V.push_back(this->priv->test_action_sequence[i]);
}